

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__jpeg_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 c;
  bool bVar4;
  bool bVar5;
  byte bVar6;
  short sVar7;
  int *piVar8;
  byte bVar9;
  stbi_uc sVar10;
  int iVar11;
  stbi__uint32 sVar12;
  int iVar13;
  int iVar14;
  stbi__jpeg *z;
  byte *pbVar15;
  void *pvVar16;
  code *pcVar17;
  undefined8 *puVar18;
  int iVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  undefined8 *puVar23;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar24;
  uint extraout_EDX_01;
  uint uVar25;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int why;
  int why_00;
  undefined8 extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  undefined8 extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  anon_struct_96_18_0d0905d3 *extraout_RDX_03;
  anon_struct_96_18_0d0905d3 *paVar26;
  ulong extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 uVar27;
  undefined7 uVar29;
  stbi_uc *psVar28;
  stbi_uc *extraout_RDX_06;
  stbi_uc *extraout_RDX_07;
  ulong uVar30;
  int iVar31;
  undefined1 *puVar32;
  byte *pbVar33;
  long lVar34;
  stbi_uc *psVar35;
  short *psVar36;
  int iVar37;
  stbi__context *psVar38;
  uint uVar39;
  ulong uVar40;
  stbi_uc **ppsVar41;
  short sVar42;
  uint uVar43;
  int iVar44;
  ulong uVar45;
  long *in_FS_OFFSET;
  undefined1 auVar46 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_164;
  stbi_uc *local_158 [3];
  long lStack_140;
  int *local_138;
  int local_130;
  int local_12c;
  long local_128;
  anon_struct_96_18_0d0905d3 *local_120;
  int *local_118;
  stbi__uint32 *local_110;
  stbi__uint32 *local_108;
  int *local_100;
  short local_f8 [4];
  long local_f0 [2];
  int local_e0 [44];
  
  z = (stbi__jpeg *)malloc(0x4888);
  if (z == (stbi__jpeg *)0x0) {
    *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
    pvVar16 = (void *)0x0;
  }
  else {
    z->s = s;
    z->idct_block_kernel = stbi__idct_simd;
    z->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    z->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      z->img_comp[0].raw_data = (void *)0x0;
      z->img_comp[0].raw_coeff = (void *)0x0;
      z->img_comp[1].raw_data = (void *)0x0;
      z->img_comp[1].raw_coeff = (void *)0x0;
      z->img_comp[2].raw_data = (void *)0x0;
      z->img_comp[2].raw_coeff = (void *)0x0;
      z->img_comp[3].raw_data = (void *)0x0;
      z->img_comp[3].raw_coeff = (void *)0x0;
      z->restart_interval = 0;
      local_110 = (stbi__uint32 *)x;
      local_108 = (stbi__uint32 *)y;
      local_100 = comp;
      iVar11 = stbi__decode_jpeg_header(z,0);
      uVar39 = extraout_EDX;
      if (iVar11 != 0) {
        paVar1 = z->img_comp;
        bVar9 = stbi__get_marker(z);
        local_138 = z->huff_ac[0].delta + 9;
        uVar27 = extraout_RDX;
LAB_001b2fae:
        if (bVar9 == 0xda) {
          iVar11 = stbi__get16be(z->s);
          psVar38 = z->s;
          pbVar33 = psVar38->img_buffer;
          paVar26 = extraout_RDX_02;
          if (psVar38->img_buffer_end <= pbVar33) {
            if (psVar38->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar38);
              pbVar33 = psVar38->img_buffer;
              paVar26 = extraout_RDX_03;
              goto LAB_001b304f;
            }
            z->scan_n = 0;
LAB_001b43aa:
            pcVar20 = "bad SOS component count";
            goto LAB_001b43b1;
          }
LAB_001b304f:
          psVar38->img_buffer = pbVar33 + 1;
          bVar9 = *pbVar33;
          z->scan_n = (uint)bVar9;
          if (((byte)(bVar9 - 5) < 0xfc) || (psVar38 = z->s, psVar38->img_n < (int)(uint)bVar9))
          goto LAB_001b43aa;
          if (iVar11 != (uint)bVar9 * 2 + 6) {
            pcVar20 = "bad SOS len";
            goto LAB_001b43b1;
          }
          lVar22 = 0;
          do {
            pbVar15 = psVar38->img_buffer;
            pbVar33 = psVar38->img_buffer_end;
            if (pbVar15 < pbVar33) {
LAB_001b30bf:
              psVar38->img_buffer = pbVar15 + 1;
              uVar24 = (uint)*pbVar15;
              psVar38 = z->s;
              pbVar15 = psVar38->img_buffer;
              pbVar33 = psVar38->img_buffer_end;
            }
            else {
              if (psVar38->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar38);
                pbVar15 = psVar38->img_buffer;
                goto LAB_001b30bf;
              }
              uVar24 = 0;
            }
            if (pbVar15 < pbVar33) {
LAB_001b30fe:
              psVar38->img_buffer = pbVar15 + 1;
              bVar9 = *pbVar15;
              psVar38 = z->s;
            }
            else {
              if (psVar38->read_from_callbacks != 0) {
                stbi__refill_buffer(psVar38);
                pbVar15 = psVar38->img_buffer;
                goto LAB_001b30fe;
              }
              bVar9 = 0;
            }
            uVar39 = psVar38->img_n;
            if ((long)(int)uVar39 < 1) {
              uVar30 = 0;
            }
            else {
              uVar30 = 0;
              paVar26 = paVar1;
              while (paVar26->id != uVar24) {
                uVar30 = uVar30 + 1;
                paVar26 = paVar26 + 1;
                if ((long)(int)uVar39 == uVar30) goto LAB_001b43c4;
              }
            }
            if ((uint)uVar30 == uVar39) goto LAB_001b43c4;
            uVar45 = uVar30 & 0xffffffff;
            paVar26 = (anon_struct_96_18_0d0905d3 *)(uVar45 * 0x60);
            z->img_comp[uVar45].hd = (uint)(bVar9 >> 4);
            if (0x3f < bVar9) {
              pcVar20 = "bad DC huff";
              goto LAB_001b43b1;
            }
            paVar26 = paVar1 + uVar45;
            paVar26->ha = bVar9 & 0xf;
            if (3 < (bVar9 & 0xf)) {
              pcVar20 = "bad AC huff";
              goto LAB_001b43b1;
            }
            z->order[lVar22] = (uint)uVar30;
            lVar22 = lVar22 + 1;
          } while (lVar22 < z->scan_n);
          pbVar33 = psVar38->img_buffer;
          if (pbVar33 < psVar38->img_buffer_end) {
LAB_001b31c8:
            psVar38->img_buffer = pbVar33 + 1;
            uVar39 = (uint)*pbVar33;
            psVar38 = z->s;
          }
          else {
            if (psVar38->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar38);
              pbVar33 = psVar38->img_buffer;
              goto LAB_001b31c8;
            }
            uVar39 = 0;
          }
          z->spec_start = uVar39;
          pbVar33 = psVar38->img_buffer;
          if (pbVar33 < psVar38->img_buffer_end) {
LAB_001b320c:
            psVar38->img_buffer = pbVar33 + 1;
            uVar39 = (uint)*pbVar33;
            psVar38 = z->s;
          }
          else {
            if (psVar38->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar38);
              pbVar33 = psVar38->img_buffer;
              goto LAB_001b320c;
            }
            uVar39 = 0;
          }
          z->spec_end = uVar39;
          pbVar33 = psVar38->img_buffer;
          if (pbVar33 < psVar38->img_buffer_end) {
LAB_001b3250:
            psVar38->img_buffer = pbVar33 + 1;
            uVar39 = (uint)*pbVar33;
          }
          else {
            if (psVar38->read_from_callbacks != 0) {
              stbi__refill_buffer(psVar38);
              pbVar33 = psVar38->img_buffer;
              goto LAB_001b3250;
            }
            uVar39 = 0;
          }
          z->succ_high = uVar39 >> 4;
          uVar24 = uVar39 & 0xf;
          paVar26 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar24;
          z->succ_low = uVar24;
          iVar11 = z->progressive;
          iVar44 = z->spec_start;
          if (iVar11 == 0) {
            if (iVar44 != 0 || uVar39 != 0) {
LAB_001b4400:
              pcVar20 = "bad SOS";
              goto LAB_001b43b1;
            }
            z->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar44) || (0x3f < z->spec_end)) || (z->spec_end < iVar44)) ||
                  ((0xdf < uVar39 || (0xd < uVar24)))) goto LAB_001b4400;
          uVar39 = z->scan_n;
          uVar30 = (ulong)uVar39;
          iVar44 = z->restart_interval;
          if (iVar44 == 0) {
            iVar44 = 0x7fffffff;
          }
          z->code_buffer = 0;
          z->code_bits = 0;
          z->nomore = 0;
          z->img_comp[3].dc_pred = 0;
          z->img_comp[2].dc_pred = 0;
          z->img_comp[1].dc_pred = 0;
          z->img_comp[0].dc_pred = 0;
          z->marker = 0xff;
          z->todo = iVar44;
          z->eob_run = 0;
          if (iVar11 == 0) {
            if (uVar39 == 1) {
              iVar11 = z->order[0];
              iVar44 = z->img_comp[iVar11].y + 7 >> 3;
              bVar4 = true;
              uVar39 = 1;
              if (0 < iVar44) {
                uVar24 = paVar1[iVar11].x + 7 >> 3;
                iVar37 = 0;
                iVar14 = 0;
                do {
                  if (0 < (int)uVar24) {
                    lVar22 = 0;
                    do {
                      iVar19 = stbi__jpeg_decode_block
                                         (z,local_f8,z->huff_dc + paVar1[iVar11].hd,
                                          z->huff_ac + paVar1[iVar11].ha,
                                          z->fast_ac[paVar1[iVar11].ha],iVar11,
                                          z->dequant[paVar1[iVar11].tq]);
                      uVar39 = extraout_EDX_02;
                      if (iVar19 == 0) goto LAB_001b415a;
                      (*z->idct_block_kernel)
                                (paVar1[iVar11].data + lVar22 + iVar37 * paVar1[iVar11].w2,
                                 paVar1[iVar11].w2,local_f8);
                      uVar39 = (uint)extraout_RDX_04;
                      iVar19 = z->todo;
                      z->todo = iVar19 + -1;
                      uVar30 = extraout_RDX_04;
                      if (iVar19 < 2) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar39 = extraout_EDX_03;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_001b3d32;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar19 = z->restart_interval;
                        uVar30 = 0x7fffffff;
                        if (iVar19 == 0) {
                          iVar19 = 0x7fffffff;
                        }
                        z->todo = iVar19;
                        z->eob_run = 0;
                      }
                      lVar22 = lVar22 + 8;
                    } while ((ulong)uVar24 * 8 != lVar22);
                  }
                  uVar39 = (uint)uVar30;
                  iVar14 = iVar14 + 1;
                  iVar37 = iVar37 + 8;
                } while (iVar14 != iVar44);
LAB_001b3d32:
                bVar4 = true;
              }
            }
            else {
              uVar39 = z->img_mcu_y;
              uVar30 = (ulong)uVar39;
              bVar4 = true;
              if (0 < (int)uVar39) {
                iVar11 = z->img_mcu_x;
                iVar14 = 0;
                do {
                  if (0 < iVar11) {
                    uVar24 = 0;
                    do {
                      iVar11 = z->scan_n;
                      if (0 < iVar11) {
                        uVar30 = 0;
                        do {
                          iVar44 = z->order[uVar30];
                          iVar37 = z->img_comp[iVar44].v;
                          if (0 < iVar37) {
                            iVar11 = paVar1[iVar44].h;
                            iVar19 = 0;
                            do {
                              if (0 < iVar11) {
                                iVar37 = 0;
                                do {
                                  iVar31 = paVar1[iVar44].v;
                                  iVar13 = stbi__jpeg_decode_block
                                                     (z,local_f8,z->huff_dc + paVar1[iVar44].hd,
                                                      z->huff_ac + paVar1[iVar44].ha,
                                                      z->fast_ac[paVar1[iVar44].ha],iVar44,
                                                      z->dequant[paVar1[iVar44].tq]);
                                  uVar39 = extraout_EDX_05;
                                  if (iVar13 == 0) goto LAB_001b415a;
                                  (*z->idct_block_kernel)
                                            (paVar1[iVar44].data +
                                             (long)(int)((iVar11 * uVar24 + iVar37) * 8) +
                                             (long)((iVar31 * iVar14 + iVar19) * paVar1[iVar44].w2 *
                                                   8),paVar1[iVar44].w2,local_f8);
                                  iVar37 = iVar37 + 1;
                                  iVar11 = paVar1[iVar44].h;
                                } while (iVar37 < iVar11);
                                iVar37 = paVar1[iVar44].v;
                              }
                              iVar19 = iVar19 + 1;
                            } while (iVar19 < iVar37);
                            iVar11 = z->scan_n;
                          }
                          uVar30 = uVar30 + 1;
                        } while ((long)uVar30 < (long)iVar11);
                        iVar44 = z->todo;
                      }
                      uVar39 = (uint)uVar30;
                      bVar4 = true;
                      z->todo = iVar44 + -1;
                      bVar5 = iVar44 < 2;
                      iVar44 = iVar44 + -1;
                      if (bVar5) {
                        if (z->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(z);
                          uVar39 = extraout_EDX_06;
                        }
                        if ((z->marker & 0xf8) != 0xd0) goto LAB_001b415c;
                        z->code_buffer = 0;
                        z->code_bits = 0;
                        z->nomore = 0;
                        z->img_comp[3].dc_pred = 0;
                        z->img_comp[2].dc_pred = 0;
                        z->img_comp[1].dc_pred = 0;
                        z->img_comp[0].dc_pred = 0;
                        z->marker = 0xff;
                        iVar44 = z->restart_interval;
                        if (iVar44 == 0) {
                          iVar44 = 0x7fffffff;
                        }
                        z->todo = iVar44;
                        z->eob_run = 0;
                      }
                      uVar24 = uVar24 + 1;
                      uVar30 = (ulong)uVar24;
                      iVar11 = z->img_mcu_x;
                    } while ((int)uVar24 < iVar11);
                    uVar30 = (ulong)(uint)z->img_mcu_y;
                  }
                  bVar4 = true;
                  iVar14 = iVar14 + 1;
                  uVar39 = (uint)uVar30;
                } while (iVar14 < (int)uVar39);
              }
            }
            goto LAB_001b415c;
          }
          if (uVar39 == 1) {
            local_128 = (long)z->order[0];
            local_12c = z->img_comp[local_128].y + 7 >> 3;
            if (0 < local_12c) {
              local_120 = paVar1 + local_128;
              local_130 = z->img_comp[local_128].x + 7 >> 3;
              local_164 = 0;
              do {
                if (0 < local_130) {
                  iVar11 = 0;
                  do {
                    piVar8 = local_138;
                    psVar36 = local_120->coeff + (local_120->coeff_w * local_164 + iVar11) * 0x40;
                    uVar30 = (ulong)z->spec_start;
                    if (uVar30 == 0) {
                      iVar44 = stbi__jpeg_decode_block_prog_dc
                                         (z,psVar36,z->huff_dc + local_120->hd,(int)local_128);
                      uVar39 = extraout_EDX_01;
                      if (iVar44 == 0) goto LAB_001b43c4;
                    }
                    else {
                      lVar22 = (long)local_120->ha;
                      iVar44 = z->eob_run;
                      bVar9 = (byte)z->succ_low;
                      if (z->succ_high == 0) {
                        if (iVar44 == 0) {
LAB_001b381e:
                          if (z->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(z);
                          }
                          uVar39 = z->code_buffer;
                          uVar45 = (ulong)(uVar39 >> 0x17);
                          sVar42 = z->fast_ac[lVar22][uVar45];
                          uVar24 = (uint)sVar42;
                          iVar44 = (int)uVar30;
                          if (sVar42 == 0) {
                            if (z->code_bits < 0x10) {
                              stbi__grow_buffer_unsafe(z);
                              uVar39 = z->code_buffer;
                              uVar45 = (ulong)(uVar39 >> 0x17);
                            }
                            paVar26 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar39;
                            uVar30 = (ulong)z->huff_ac[lVar22].fast[uVar45];
                            if (uVar30 == 0xff) {
                              lVar21 = 0;
                              do {
                                lVar34 = lVar21;
                                lVar21 = lVar34 + 1;
                              } while ((uint)piVar8[lVar22 * 0x1a4 + lVar34 + -0x11] <=
                                       uVar39 >> 0x10);
                              iVar14 = z->code_bits;
                              if (lVar21 == 8) {
                                z->code_bits = iVar14 + -0x10;
LAB_001b4cb2:
                                pcVar20 = "bad huffman code";
                                goto LAB_001b43b1;
                              }
                              if (iVar14 < (int)(lVar34 + 10)) goto LAB_001b4cb2;
                              uVar24 = stbi__bmask[lVar34 + 10];
                              iVar37 = piVar8[lVar22 * 0x1a4 + lVar21];
                              sVar12 = uVar39 << ((byte)(lVar34 + 10) & 0x1f);
                              iVar14 = (iVar14 - (int)lVar21) + -9;
                              z->code_bits = iVar14;
                              z->code_buffer = sVar12;
                              uVar30 = (ulong)(int)((uVar39 >> (0x17U - (char)lVar21 & 0x1f) &
                                                    uVar24) + iVar37);
                            }
                            else {
                              bVar2 = z->huff_ac[lVar22].size[uVar30];
                              iVar14 = z->code_bits - (uint)bVar2;
                              if (z->code_bits < (int)(uint)bVar2) goto LAB_001b4cb2;
                              sVar12 = uVar39 << (bVar2 & 0x1f);
                              z->code_buffer = sVar12;
                              z->code_bits = iVar14;
                            }
                            bVar2 = z->huff_ac[lVar22].values[uVar30];
                            uVar24 = bVar2 & 0xf;
                            bVar6 = bVar2 >> 4;
                            uVar39 = (uint)bVar6;
                            if ((bVar2 & 0xf) == 0) {
                              if (bVar2 < 0xf0) {
                                iVar44 = 1 << bVar6;
                                z->eob_run = iVar44;
                                if (0xf < bVar2) {
                                  if (iVar14 < (int)uVar39) {
                                    stbi__grow_buffer_unsafe(z);
                                    sVar12 = z->code_buffer;
                                    iVar14 = z->code_bits;
                                    iVar44 = z->eob_run;
                                  }
                                  uVar25 = sVar12 << bVar6 | sVar12 >> 0x20 - bVar6;
                                  uVar24 = stbi__bmask[uVar39];
                                  z->code_buffer = ~uVar24 & uVar25;
                                  iVar44 = iVar44 + (uVar25 & uVar24);
                                  z->code_bits = iVar14 - uVar39;
                                }
                                goto LAB_001b3529;
                              }
                              uVar39 = iVar44 + 0x10;
                            }
                            else {
                              lVar21 = (long)iVar44 + (ulong)uVar39;
                              bVar2 = ""[lVar21];
                              if (iVar14 < (int)uVar24) {
                                stbi__grow_buffer_unsafe(z);
                                sVar12 = z->code_buffer;
                                iVar14 = z->code_bits;
                              }
                              uVar43 = sVar12 << (sbyte)uVar24 | sVar12 >> 0x20 - (sbyte)uVar24;
                              uVar25 = *(uint *)((long)stbi__bmask + (ulong)(uVar24 * 4));
                              z->code_buffer = ~uVar25 & uVar43;
                              z->code_bits = iVar14 - uVar24;
                              iVar44 = 0;
                              if (-1 < (int)sVar12) {
                                iVar44 = *(int *)((long)stbi__jbias + (ulong)(uVar24 * 4));
                              }
                              uVar39 = (int)lVar21 + 1;
                              psVar36[bVar2] = (short)((uVar25 & uVar43) + iVar44 << (bVar9 & 0x1f))
                              ;
                            }
                          }
                          else {
                            lVar21 = (long)iVar44 + (ulong)(uVar24 >> 4 & 0xf);
                            z->code_buffer = uVar39 << (sbyte)(uVar24 & 0xf);
                            z->code_bits = z->code_bits - (uVar24 & 0xf);
                            uVar39 = (int)lVar21 + 1;
                            psVar36[""[lVar21]] = (short)((uVar24 >> 8) << (bVar9 & 0x1f));
                          }
                          uVar30 = (ulong)uVar39;
                          if (z->spec_end < (int)uVar39) goto LAB_001b3a2e;
                          goto LAB_001b381e;
                        }
LAB_001b3529:
                        z->eob_run = iVar44 + -1;
                      }
                      else if (iVar44 == 0) {
                        iVar44 = 0x10000 << (bVar9 & 0x1f);
                        local_118 = local_138 + lVar22 * 0x1a4;
                        do {
                          piVar8 = local_118;
                          if (z->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(z);
                          }
                          uVar39 = z->code_buffer;
                          uVar45 = (ulong)z->huff_ac[lVar22].fast[uVar39 >> 0x17];
                          if (uVar45 == 0xff) {
                            lVar21 = 0;
                            do {
                              lVar34 = lVar21;
                              lVar21 = lVar34 + 1;
                            } while ((uint)piVar8[lVar34 + -0x11] <= uVar39 >> 0x10);
                            uVar24 = z->code_bits;
                            paVar26 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar24;
                            if (lVar21 == 8) {
                              paVar26 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar24 - 0x10);
                              z->code_bits = uVar24 - 0x10;
                              goto LAB_001b4cb2;
                            }
                            if ((int)uVar24 < (int)(lVar34 + 10)) goto LAB_001b4cb2;
                            uVar25 = stbi__bmask[lVar34 + 10];
                            iVar14 = piVar8[lVar21];
                            sVar12 = uVar39 << ((byte)(lVar34 + 10) & 0x1f);
                            uVar24 = (uVar24 - (int)lVar21) - 9;
                            paVar26 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar24;
                            z->code_bits = uVar24;
                            z->code_buffer = sVar12;
                            uVar45 = (ulong)(int)((uVar39 >> (0x17U - (char)lVar21 & 0x1f) & uVar25)
                                                 + iVar14);
                          }
                          else {
                            bVar2 = z->huff_ac[lVar22].size[uVar45];
                            uVar24 = z->code_bits - (uint)bVar2;
                            paVar26 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar24;
                            if (z->code_bits < (int)(uint)bVar2) goto LAB_001b4cb2;
                            sVar12 = uVar39 << (bVar2 & 0x1f);
                            z->code_buffer = sVar12;
                            z->code_bits = uVar24;
                          }
                          iVar14 = (int)paVar26;
                          bVar2 = z->huff_ac[lVar22].values[uVar45];
                          bVar6 = bVar2 >> 4;
                          uVar39 = (uint)bVar6;
                          uVar45 = (ulong)uVar39;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar14 < 1) {
                              stbi__grow_buffer_unsafe(z);
                              sVar12 = z->code_buffer;
                              iVar14 = z->code_bits;
                            }
                            z->code_buffer = sVar12 * 2;
                            z->code_bits = iVar14 + -1;
                            sVar42 = (short)(((int)~sVar12 >> 0x1f | 1U) << (bVar9 & 0x1f));
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_001b4cb2;
                            if (bVar2 < 0xf0) {
                              uVar24 = ~(-1 << bVar6);
                              z->eob_run = uVar24;
                              uVar40 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar14 < (int)uVar39) {
                                  stbi__grow_buffer_unsafe(z);
                                  sVar12 = z->code_buffer;
                                  iVar14 = z->code_bits;
                                  uVar24 = z->eob_run;
                                }
                                uVar43 = sVar12 << bVar6 | sVar12 >> 0x20 - bVar6;
                                uVar25 = stbi__bmask[uVar45];
                                z->code_buffer = ~uVar25 & uVar43;
                                z->code_bits = iVar14 - uVar39;
                                z->eob_run = (uVar43 & uVar25) + uVar24;
                              }
                            }
                            else {
                              uVar40 = 0xf;
                            }
                            sVar42 = 0;
                            uVar45 = uVar40;
                          }
                          iVar14 = z->spec_end;
                          if ((int)uVar30 <= iVar14) {
                            uVar40 = (long)(int)uVar30;
                            do {
                              bVar2 = ""[uVar40];
                              if (psVar36[bVar2] == 0) {
                                if ((int)uVar45 == 0) {
                                  uVar30 = (ulong)((int)uVar40 + 1);
                                  psVar36[bVar2] = sVar42;
                                  iVar14 = z->spec_end;
                                  break;
                                }
                                uVar45 = (ulong)((int)uVar45 - 1);
                              }
                              else {
                                iVar14 = z->code_bits;
                                if (iVar14 < 1) {
                                  stbi__grow_buffer_unsafe(z);
                                  iVar14 = z->code_bits;
                                }
                                sVar12 = z->code_buffer;
                                z->code_buffer = sVar12 * 2;
                                z->code_bits = iVar14 + -1;
                                if (((int)sVar12 < 0) &&
                                   (sVar3 = psVar36[bVar2], (iVar44 >> 0x10 & (int)sVar3) == 0)) {
                                  sVar7 = (short)((uint)iVar44 >> 0x10);
                                  if (sVar3 < 1) {
                                    sVar7 = -sVar7;
                                  }
                                  psVar36[bVar2] = sVar3 + sVar7;
                                }
                              }
                              uVar30 = uVar40 + 1;
                              iVar14 = z->spec_end;
                              bVar4 = (long)uVar40 < (long)iVar14;
                              uVar40 = uVar30;
                            } while (bVar4);
                          }
                        } while ((int)uVar30 <= iVar14);
                      }
                      else {
                        z->eob_run = iVar44 + -1;
                        if (z->spec_start <= z->spec_end) {
                          uVar39 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                          do {
                            bVar9 = ""[uVar30];
                            if (psVar36[bVar9] != 0) {
                              iVar44 = z->code_bits;
                              if (iVar44 < 1) {
                                stbi__grow_buffer_unsafe(z);
                                iVar44 = z->code_bits;
                              }
                              sVar12 = z->code_buffer;
                              z->code_buffer = sVar12 * 2;
                              z->code_bits = iVar44 + -1;
                              if (((int)sVar12 < 0) &&
                                 (sVar42 = psVar36[bVar9], (uVar39 & (int)sVar42) == 0)) {
                                uVar24 = -uVar39;
                                if (0 < sVar42) {
                                  uVar24 = uVar39;
                                }
                                psVar36[bVar9] = (short)uVar24 + sVar42;
                              }
                            }
                            bVar4 = (long)uVar30 < (long)z->spec_end;
                            uVar30 = uVar30 + 1;
                          } while (bVar4);
                        }
                      }
                    }
LAB_001b3a2e:
                    iVar44 = z->todo;
                    z->todo = iVar44 + -1;
                    if (iVar44 < 2) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                      }
                      bVar9 = z->marker;
                      if ((bVar9 & 0xf8) != 0xd0) goto LAB_001b416c;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar44 = z->restart_interval;
                      if (iVar44 == 0) {
                        iVar44 = 0x7fffffff;
                      }
                      z->todo = iVar44;
                      z->eob_run = 0;
                    }
                    iVar11 = iVar11 + 1;
                  } while (iVar11 != local_130);
                }
                local_164 = local_164 + 1;
              } while (local_164 != local_12c);
            }
          }
          else {
            iVar11 = z->img_mcu_y;
            if (0 < iVar11) {
              iVar14 = z->img_mcu_x;
              iVar37 = 0;
              do {
                if (0 < iVar14) {
                  iVar11 = 0;
                  do {
                    iVar14 = z->scan_n;
                    if (0 < iVar14) {
                      lVar22 = 0;
                      do {
                        iVar44 = z->order[lVar22];
                        iVar19 = z->img_comp[iVar44].v;
                        if (0 < iVar19) {
                          iVar14 = paVar1[iVar44].h;
                          iVar31 = 0;
                          do {
                            if (0 < iVar14) {
                              iVar19 = 0;
                              do {
                                iVar14 = stbi__jpeg_decode_block_prog_dc
                                                   (z,paVar1[iVar44].coeff +
                                                      (iVar14 * iVar11 + iVar19 +
                                                      (paVar1[iVar44].v * iVar37 + iVar31) *
                                                      paVar1[iVar44].coeff_w) * 0x40,
                                                    z->huff_dc + paVar1[iVar44].hd,iVar44);
                                uVar39 = extraout_EDX_04;
                                if (iVar14 == 0) goto LAB_001b43c4;
                                iVar19 = iVar19 + 1;
                                iVar14 = paVar1[iVar44].h;
                              } while (iVar19 < iVar14);
                              iVar19 = paVar1[iVar44].v;
                            }
                            iVar31 = iVar31 + 1;
                          } while (iVar31 < iVar19);
                          iVar14 = z->scan_n;
                        }
                        lVar22 = lVar22 + 1;
                      } while (lVar22 < iVar14);
                      iVar44 = z->todo;
                    }
                    z->todo = iVar44 + -1;
                    bVar4 = iVar44 < 2;
                    iVar44 = iVar44 + -1;
                    if (bVar4) {
                      if (z->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(z);
                      }
                      bVar9 = z->marker;
                      if ((bVar9 & 0xf8) != 0xd0) goto LAB_001b416c;
                      z->code_buffer = 0;
                      z->code_bits = 0;
                      z->nomore = 0;
                      z->img_comp[3].dc_pred = 0;
                      z->img_comp[2].dc_pred = 0;
                      z->img_comp[1].dc_pred = 0;
                      z->img_comp[0].dc_pred = 0;
                      z->marker = 0xff;
                      iVar44 = z->restart_interval;
                      if (iVar44 == 0) {
                        iVar44 = 0x7fffffff;
                      }
                      z->todo = iVar44;
                      z->eob_run = 0;
                    }
                    iVar11 = iVar11 + 1;
                    iVar14 = z->img_mcu_x;
                  } while (iVar11 < iVar14);
                  iVar11 = z->img_mcu_y;
                }
                iVar37 = iVar37 + 1;
              } while (iVar37 < iVar11);
            }
          }
          goto LAB_001b4164;
        }
        uVar39 = (uint)bVar9;
        if (uVar39 == 0xdc) {
          iVar11 = stbi__get16be(z->s);
          sVar12 = stbi__get16be(z->s);
          paVar26 = extraout_RDX_00;
          if (iVar11 == 4) {
            if (sVar12 == z->s->img_y) goto LAB_001b3006;
            pcVar20 = "bad DNL height";
          }
          else {
            pcVar20 = "bad DNL len";
          }
LAB_001b43b1:
          uVar39 = (uint)paVar26;
          *(char **)(*in_FS_OFFSET + -0x20) = pcVar20;
        }
        else {
          if (uVar39 == 0xd9) {
            psVar38 = z->s;
            uVar24 = psVar38->img_n;
            if (z->progressive == 0) goto LAB_001b433f;
            if ((int)uVar24 < 1) {
              uVar30 = 0;
              uVar45 = (ulong)(req_comp + (uint)(req_comp == 0));
            }
            else {
              lVar22 = 0;
              do {
                iVar11 = z->img_comp[lVar22].y + 7 >> 3;
                if (0 < iVar11) {
                  uVar39 = paVar1[lVar22].x + 7 >> 3;
                  iVar44 = 0;
                  do {
                    if (0 < (int)uVar39) {
                      uVar30 = 0;
                      do {
                        psVar36 = paVar1[lVar22].coeff +
                                  (paVar1[lVar22].coeff_w * iVar44 + (int)uVar30) * 0x40;
                        iVar14 = paVar1[lVar22].tq;
                        lVar21 = 0;
                        do {
                          psVar36[lVar21] = psVar36[lVar21] * z->dequant[iVar14][lVar21];
                          lVar21 = lVar21 + 1;
                        } while (lVar21 != 0x40);
                        (*z->idct_block_kernel)
                                  (paVar1[lVar22].data +
                                   uVar30 * 8 + (long)(iVar44 * 8 * paVar1[lVar22].w2),
                                   paVar1[lVar22].w2,psVar36);
                        uVar30 = uVar30 + 1;
                        uVar27 = extraout_RDX_05;
                      } while (uVar30 != uVar39);
                    }
                    iVar44 = iVar44 + 1;
                  } while (iVar44 != iVar11);
                  psVar38 = z->s;
                }
                lVar22 = lVar22 + 1;
                uVar24 = psVar38->img_n;
              } while (lVar22 < (int)uVar24);
LAB_001b433f:
              uVar39 = (2 < (int)uVar24) + 1 + (uint)(2 < (int)uVar24);
              if (req_comp != 0) {
                uVar39 = req_comp;
              }
              uVar45 = (ulong)uVar39;
              uVar39 = uVar24;
              if (uVar24 == 3) {
                uVar29 = (undefined7)((ulong)uVar27 >> 8);
                uVar30 = CONCAT71(uVar29,1);
                uVar24 = 3;
                if (z->rgb != 3) {
                  uVar39 = 3;
                  if (z->app14_color_transform != 0) goto LAB_001b437c;
                  uVar30 = CONCAT71(uVar29,z->jfif == 0);
                }
              }
              else {
LAB_001b437c:
                uVar24 = uVar39;
                uVar30 = 0;
              }
            }
            uVar39 = (uint)uVar30;
            uVar25 = 1;
            if ((uVar30 & 1) != 0) {
              uVar25 = uVar24;
            }
            iVar11 = (int)uVar45;
            if (2 < iVar11) {
              uVar25 = uVar24;
            }
            if (uVar24 != 3) {
              uVar25 = uVar24;
            }
            if ((int)uVar25 < 1) goto LAB_001b43ce;
            local_138 = (int *)CONCAT44(local_138._4_4_,uVar39);
            local_158[2] = (stbi_uc *)0x0;
            lStack_140 = 0;
            local_158[0] = (stbi_uc *)0x0;
            local_158[1] = (stbi_uc *)0x0;
            sVar12 = psVar38->img_x;
            lVar22 = 0;
            while( true ) {
              pvVar16 = malloc((ulong)(sVar12 + 3));
              *(void **)((long)&z->img_comp[0].linebuf + lVar22 * 2) = pvVar16;
              if (pvVar16 == (void *)0x0) break;
              uVar30 = (long)z->img_h_max / (long)*(int *)((long)&z->img_comp[0].h + lVar22 * 2);
              iVar44 = (int)uVar30;
              *(int *)((long)local_e0 + lVar22) = iVar44;
              iVar14 = z->img_v_max / *(int *)((long)&z->img_comp[0].v + lVar22 * 2);
              *(int *)((long)local_e0 + lVar22 + 4) = iVar14;
              *(int *)((long)local_e0 + lVar22 + 0xc) = iVar14 >> 1;
              sVar12 = psVar38->img_x;
              *(int *)((long)local_e0 + lVar22 + 8) =
                   (int)((ulong)((iVar44 + sVar12) - 1) / (uVar30 & 0xffffffff));
              *(undefined4 *)((long)local_e0 + lVar22 + 0x10) = 0;
              uVar27 = *(undefined8 *)((long)&z->img_comp[0].data + lVar22 * 2);
              *(undefined8 *)((long)local_f0 + lVar22 + 8) = uVar27;
              *(undefined8 *)((long)local_f0 + lVar22) = uVar27;
              if (iVar44 == 2) {
                pcVar17 = stbi__resample_row_h_2;
                if (iVar14 != 1) {
                  if (iVar14 != 2) goto LAB_001b4547;
                  pcVar17 = z->resample_row_hv_2_kernel;
                }
              }
              else if (iVar44 == 1) {
                pcVar17 = stbi__resample_row_generic;
                if (iVar14 == 2) {
                  pcVar17 = stbi__resample_row_v_2;
                }
                if (iVar14 == 1) {
                  pcVar17 = resample_row_1;
                }
              }
              else {
LAB_001b4547:
                pcVar17 = stbi__resample_row_generic;
              }
              *(code **)((long)local_f8 + lVar22) = pcVar17;
              lVar22 = lVar22 + 0x30;
              if ((ulong)uVar25 * 0x30 == lVar22) {
                c = psVar38->img_y;
                pvVar16 = stbi__malloc_mad3(iVar11,sVar12,c,1);
                if (pvVar16 != (void *)0x0) {
                  iVar44 = why_00;
                  if (c != 0) {
                    iVar14 = 0;
                    uVar39 = 0;
                    do {
                      sVar12 = psVar38->img_x;
                      ppsVar41 = local_158;
                      lVar22 = 0;
                      do {
                        puVar18 = (undefined8 *)((long)local_f0 + lVar22 + 8);
                        iVar44 = *(int *)((long)local_e0 + lVar22 + 0xc);
                        iVar37 = *(int *)((long)local_e0 + lVar22 + 4);
                        iVar19 = iVar37 >> 1;
                        puVar23 = puVar18;
                        if (iVar44 < iVar19) {
                          puVar23 = (undefined8 *)((long)local_f0 + lVar22);
                        }
                        if (iVar19 <= iVar44) {
                          puVar18 = (undefined8 *)((long)local_f0 + lVar22);
                        }
                        auVar46 = (**(code **)((long)local_f8 + lVar22))
                                            (*(undefined8 *)
                                              ((long)&z->img_comp[0].linebuf + lVar22 * 2),*puVar23,
                                             *puVar18,*(undefined4 *)((long)local_e0 + lVar22 + 8),
                                             *(undefined4 *)((long)local_e0 + lVar22));
                        psVar28 = auVar46._8_8_;
                        *ppsVar41 = auVar46._0_8_;
                        *(int *)((long)local_e0 + lVar22 + 0xc) = iVar44 + 1;
                        if (iVar37 <= iVar44 + 1) {
                          *(undefined4 *)((long)local_e0 + lVar22 + 0xc) = 0;
                          lVar21 = *(long *)((long)local_f0 + lVar22 + 8);
                          *(long *)((long)local_f0 + lVar22) = lVar21;
                          iVar44 = *(int *)((long)local_e0 + lVar22 + 0x10) + 1;
                          *(int *)((long)local_e0 + lVar22 + 0x10) = iVar44;
                          if (iVar44 < *(int *)((long)&z->img_comp[0].y + lVar22 * 2)) {
                            *(long *)((long)local_f0 + lVar22 + 8) =
                                 lVar21 + *(int *)((long)&z->img_comp[0].w2 + lVar22 * 2);
                          }
                        }
                        lVar22 = lVar22 + 0x30;
                        ppsVar41 = ppsVar41 + 1;
                      } while ((ulong)uVar25 * 0x30 != lVar22);
                      if (iVar11 < 3) {
                        psVar38 = z->s;
                        if ((char)local_138 == '\0') {
                          if (psVar38->img_n == 4) {
                            if (z->app14_color_transform == 2) {
                              if (psVar38->img_x != 0) {
                                puVar32 = (undefined1 *)
                                          ((long)pvVar16 + (ulong)(sVar12 * iVar14) + 1);
                                psVar28 = (stbi_uc *)0x0;
                                do {
                                  iVar44 = (local_158[0][(long)psVar28] ^ 0xff) *
                                           (uint)psVar28[lStack_140];
                                  puVar32[-1] = (char)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                                  *puVar32 = 0xff;
                                  psVar28 = psVar28 + 1;
                                  puVar32 = puVar32 + uVar45;
                                } while (psVar28 < (stbi_uc *)(ulong)psVar38->img_x);
                              }
                            }
                            else {
                              if (z->app14_color_transform != 0) goto LAB_001b498e;
                              if (psVar38->img_x != 0) {
                                puVar32 = (undefined1 *)
                                          ((long)pvVar16 + (ulong)(sVar12 * iVar14) + 1);
                                uVar30 = 0;
                                do {
                                  bVar9 = *(byte *)(lStack_140 + uVar30);
                                  iVar44 = (uint)local_158[0][uVar30] * (uint)bVar9;
                                  iVar37 = (uint)local_158[1][uVar30] * (uint)bVar9;
                                  puVar32[-1] = (char)((((uint)local_158[2][uVar30] * (uint)bVar9 +
                                                         0x80 >> 8) +
                                                        (uint)local_158[2][uVar30] * (uint)bVar9 +
                                                        0x80 >> 8) * 0x1d +
                                                       (iVar37 + (iVar37 + 0x80U >> 8) + 0x80 >> 8)
                                                       * 0x96 + (iVar44 + (iVar44 + 0x80U >> 8) +
                                                                 0x80 >> 8) * 0x4d >> 8);
                                  *puVar32 = 0xff;
                                  uVar30 = uVar30 + 1;
                                  puVar32 = puVar32 + uVar45;
                                  psVar28 = local_158[1];
                                } while (uVar30 < psVar38->img_x);
                              }
                            }
                          }
                          else {
LAB_001b498e:
                            if (iVar11 == 1) {
                              if (psVar38->img_x != 0) {
                                psVar35 = (stbi_uc *)0x0;
                                do {
                                  psVar35[(ulong)(sVar12 * iVar14) + (long)pvVar16] =
                                       local_158[0][(long)psVar35];
                                  psVar35 = psVar35 + 1;
                                  psVar28 = (stbi_uc *)(ulong)psVar38->img_x;
                                } while (psVar35 < (stbi_uc *)(ulong)psVar38->img_x);
                              }
                            }
                            else if (psVar38->img_x != 0) {
                              psVar35 = (stbi_uc *)0x0;
                              do {
                                *(stbi_uc *)
                                 ((long)pvVar16 + (long)psVar35 * 2 + (ulong)(sVar12 * iVar14)) =
                                     local_158[0][(long)psVar35];
                                *(undefined1 *)
                                 ((long)pvVar16 + (long)psVar35 * 2 + (ulong)(sVar12 * iVar14) + 1)
                                     = 0xff;
                                psVar35 = psVar35 + 1;
                                psVar28 = (stbi_uc *)(ulong)psVar38->img_x;
                              } while (psVar35 < (stbi_uc *)(ulong)psVar38->img_x);
                            }
                          }
                        }
                        else if (iVar11 == 1) {
                          if (psVar38->img_x != 0) {
                            uVar30 = 0;
                            do {
                              bVar9 = local_158[2][uVar30];
                              *(char *)((long)pvVar16 + uVar30 + sVar12 * iVar14) =
                                   (char)((uint)bVar9 * 2 + ((uint)bVar9 + (uint)bVar9 * 8) * 3 +
                                          (uint)local_158[1][uVar30] * 0x96 +
                                          (uint)local_158[0][uVar30] * 0x4d >> 8);
                              uVar30 = uVar30 + 1;
                              psVar28 = local_158[2];
                            } while (uVar30 < psVar38->img_x);
                          }
                        }
                        else if (psVar38->img_x != 0) {
                          uVar30 = 0;
                          do {
                            bVar9 = local_158[2][uVar30];
                            *(char *)((long)pvVar16 + uVar30 * 2 + (ulong)(sVar12 * iVar14)) =
                                 (char)((uint)bVar9 * 2 + ((uint)bVar9 + (uint)bVar9 * 8) * 3 +
                                        (uint)local_158[1][uVar30] * 0x96 +
                                        (uint)local_158[0][uVar30] * 0x4d >> 8);
                            *(undefined1 *)
                             ((long)pvVar16 + uVar30 * 2 + (ulong)(sVar12 * iVar14) + 1) = 0xff;
                            uVar30 = uVar30 + 1;
                            psVar28 = local_158[2];
                          } while (uVar30 < psVar38->img_x);
                        }
                      }
                      else {
                        psVar35 = (stbi_uc *)((ulong)(uVar39 * iVar11 * sVar12) + (long)pvVar16);
                        psVar38 = z->s;
                        if (psVar38->img_n == 3) {
                          if ((char)local_138 == '\0') {
LAB_001b4a02:
                            (*z->YCbCr_to_RGB_kernel)
                                      (psVar35,local_158[0],local_158[1],local_158[2],psVar38->img_x
                                       ,iVar11);
                            psVar38 = z->s;
                            psVar28 = extraout_RDX_06;
                          }
                          else if (psVar38->img_x != 0) {
                            puVar32 = (undefined1 *)((long)pvVar16 + (ulong)(sVar12 * iVar14) + 3);
                            psVar28 = (stbi_uc *)0x0;
                            do {
                              puVar32[-3] = local_158[0][(long)psVar28];
                              puVar32[-2] = local_158[1][(long)psVar28];
                              puVar32[-1] = local_158[2][(long)psVar28];
                              *puVar32 = 0xff;
                              psVar28 = psVar28 + 1;
                              puVar32 = puVar32 + uVar45;
                            } while (psVar28 < (stbi_uc *)(ulong)psVar38->img_x);
                          }
                        }
                        else if (psVar38->img_n == 4) {
                          if (z->app14_color_transform == 2) {
                            (*z->YCbCr_to_RGB_kernel)
                                      (psVar35,local_158[0],local_158[1],local_158[2],psVar38->img_x
                                       ,iVar11);
                            psVar38 = z->s;
                            psVar28 = extraout_RDX_07;
                            if (psVar38->img_x != 0) {
                              pbVar33 = (byte *)((long)pvVar16 + (ulong)(sVar12 * iVar14) + 2);
                              psVar35 = (stbi_uc *)0x0;
                              do {
                                bVar9 = psVar35[lStack_140];
                                iVar44 = (pbVar33[-2] ^ 0xff) * (uint)bVar9;
                                pbVar33[-2] = (byte)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                                iVar44 = (pbVar33[-1] ^ 0xff) * (uint)bVar9;
                                pbVar33[-1] = (byte)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                                iVar44 = (*pbVar33 ^ 0xff) * (uint)bVar9;
                                *pbVar33 = (byte)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                                psVar35 = psVar35 + 1;
                                pbVar33 = pbVar33 + uVar45;
                                psVar28 = (stbi_uc *)(ulong)psVar38->img_x;
                              } while (psVar35 < (stbi_uc *)(ulong)psVar38->img_x);
                            }
                          }
                          else {
                            if (z->app14_color_transform != 0) goto LAB_001b4a02;
                            if (psVar38->img_x != 0) {
                              puVar32 = (undefined1 *)((long)pvVar16 + (ulong)(sVar12 * iVar14) + 3)
                              ;
                              uVar30 = 0;
                              do {
                                bVar9 = *(byte *)(lStack_140 + uVar30);
                                iVar44 = (uint)local_158[0][uVar30] * (uint)bVar9;
                                puVar32[-3] = (char)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                                iVar44 = (uint)local_158[1][uVar30] * (uint)bVar9;
                                puVar32[-2] = (char)((iVar44 + 0x80U >> 8) + iVar44 + 0x80 >> 8);
                                puVar32[-1] = (char)(((uint)local_158[2][uVar30] * (uint)bVar9 +
                                                      0x80 >> 8) +
                                                     (uint)local_158[2][uVar30] * (uint)bVar9 + 0x80
                                                    >> 8);
                                *puVar32 = 0xff;
                                uVar30 = uVar30 + 1;
                                puVar32 = puVar32 + uVar45;
                                psVar28 = local_158[2];
                              } while (uVar30 < psVar38->img_x);
                            }
                          }
                        }
                        else if (psVar38->img_x != 0) {
                          puVar32 = (undefined1 *)((long)pvVar16 + (ulong)(sVar12 * iVar14) + 3);
                          uVar30 = 0;
                          do {
                            sVar10 = local_158[0][uVar30];
                            puVar32[-1] = sVar10;
                            puVar32[-2] = sVar10;
                            puVar32[-3] = sVar10;
                            *puVar32 = 0xff;
                            uVar30 = uVar30 + 1;
                            puVar32 = puVar32 + uVar45;
                          } while (uVar30 < psVar38->img_x);
                        }
                      }
                      iVar44 = (int)psVar28;
                      uVar39 = uVar39 + 1;
                      iVar14 = iVar14 + iVar11;
                    } while (uVar39 < psVar38->img_y);
                  }
                  stbi__free_jpeg_components(z,psVar38->img_n,iVar44);
                  psVar38 = z->s;
                  *local_110 = psVar38->img_x;
                  *local_108 = psVar38->img_y;
                  if (local_100 != (int *)0x0) {
                    *local_100 = (uint)(2 < psVar38->img_n) * 2 + 1;
                  }
                  goto LAB_001b43d6;
                }
                stbi__free_jpeg_components(z,psVar38->img_n,why_00);
                lVar22 = *in_FS_OFFSET;
                pcVar20 = "outofmem";
                goto LAB_001b2ec2;
              }
            }
            stbi__free_jpeg_components(z,psVar38->img_n,why);
            *(char **)(*in_FS_OFFSET + -0x20) = "outofmem";
            pvVar16 = (void *)0x0;
            goto LAB_001b43d6;
          }
          iVar11 = stbi__process_marker(z,uVar39);
          uVar39 = extraout_EDX_00;
          if (iVar11 != 0) goto LAB_001b3006;
        }
      }
LAB_001b43c4:
      uVar24 = z->s->img_n;
LAB_001b43ce:
      stbi__free_jpeg_components(z,uVar24,uVar39);
    }
    else {
      lVar22 = *in_FS_OFFSET;
      pcVar20 = "bad req_comp";
LAB_001b2ec2:
      *(char **)(lVar22 + -0x20) = pcVar20;
    }
    pvVar16 = (void *)0x0;
LAB_001b43d6:
    free(z);
  }
  return pvVar16;
LAB_001b415a:
  bVar4 = false;
LAB_001b415c:
  if (!bVar4) goto LAB_001b43c4;
LAB_001b4164:
  bVar9 = z->marker;
LAB_001b416c:
  if (bVar9 != 0xff) goto LAB_001b3006;
LAB_001b4174:
  do {
    psVar38 = z->s;
    if ((psVar38->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001b4194:
      if (psVar38->img_buffer_end <= psVar38->img_buffer) goto LAB_001b3006;
    }
    else {
      iVar11 = (*(psVar38->io).eof)(psVar38->io_user_data);
      if (iVar11 != 0) {
        if (psVar38->read_from_callbacks != 0) goto LAB_001b4194;
        goto LAB_001b3006;
      }
    }
    psVar38 = z->s;
    psVar28 = psVar38->img_buffer;
    if (psVar38->img_buffer_end <= psVar28) {
      if (psVar38->read_from_callbacks == 0) goto LAB_001b4174;
      stbi__refill_buffer(psVar38);
      psVar28 = psVar38->img_buffer;
    }
    psVar38->img_buffer = psVar28 + 1;
  } while (*psVar28 != 0xff);
  psVar38 = z->s;
  psVar28 = psVar38->img_buffer;
  if (psVar28 < psVar38->img_buffer_end) {
LAB_001b420c:
    psVar38->img_buffer = psVar28 + 1;
    sVar10 = *psVar28;
  }
  else {
    if (psVar38->read_from_callbacks != 0) {
      stbi__refill_buffer(psVar38);
      psVar28 = psVar38->img_buffer;
      goto LAB_001b420c;
    }
    sVar10 = '\0';
  }
  z->marker = sVar10;
LAB_001b3006:
  bVar9 = stbi__get_marker(z);
  uVar27 = extraout_RDX_01;
  goto LAB_001b2fae;
}

Assistant:

static void *stbi__jpeg_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   unsigned char* result;
   stbi__jpeg* j = (stbi__jpeg*) stbi__malloc(sizeof(stbi__jpeg));
   if (!j) return stbi__errpuc("outofmem", "Out of memory");
   STBI_NOTUSED(ri);
   j->s = s;
   stbi__setup_jpeg(j);
   result = load_jpeg_image(j, x,y,comp,req_comp);
   STBI_FREE(j);
   return result;
}